

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

bool __thiscall Am_Inter_Location::operator>=(Am_Inter_Location *this,Am_Inter_Location *test)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int my_bottom;
  int my_right;
  int my_top;
  int my_left;
  int test_bottom;
  int test_right;
  int test_top;
  int test_left;
  Am_Inter_Location *test_local;
  Am_Inter_Location *this_local;
  
  _test_top = test;
  test_local = this;
  if (this->data == (Am_Inter_Location_Data *)0x0) {
    Am_Error("Am_Inter_Location not initialized");
  }
  if (test->data != (Am_Inter_Location_Data *)0x0) {
    if ((this->data->as_line & 1U) != 0) {
      Am_Error("Can\'t test contain inside an Am_Inter_Location that is a Line");
    }
    iVar1 = (this->data->data).rect.left;
    iVar2 = (this->data->data).rect.top;
    iVar4 = iVar1 + (this->data->data).rect.width + 1;
    iVar5 = iVar2 + (this->data->data).rect.height + 1;
    if ((test->data->as_line & 1U) == 0) {
      test_right = (test->data->data).rect.left;
      test_bottom = (test->data->data).rect.top;
      my_left = test_right + (test->data->data).rect.width + 1;
      my_top = test_bottom + (test->data->data).rect.height + 1;
    }
    else {
      test_right = (test->data->data).rect.left;
      test_bottom = (test->data->data).rect.top;
      my_left = (test->data->data).rect.width;
      my_top = (test->data->data).rect.height;
      isort(test_right,my_left,&test_right,&my_left);
      isort(test_bottom,my_top,&test_bottom,&my_top);
    }
    bVar3 = Am_Object::operator!=(&this->data->ref_obj,&_test_top->data->ref_obj);
    if (bVar3) {
      bVar3 = Am_Translate_Coordinates
                        (&_test_top->data->ref_obj,test_right,test_bottom,&this->data->ref_obj,
                         &test_right,&test_bottom);
      if (!bVar3) {
        return false;
      }
      Am_Translate_Coordinates
                (&_test_top->data->ref_obj,my_left,my_top,&this->data->ref_obj,&my_left,&my_top);
    }
    if (((test_right < iVar1) || (iVar4 < test_right)) || (iVar4 < my_left)) {
      this_local._7_1_ = false;
    }
    else if (((test_bottom < iVar2) || (iVar5 < test_bottom)) || (iVar5 < my_top)) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
    return this_local._7_1_;
  }
  Am_Error("Other Am_Inter_Location not initialized");
}

Assistant:

bool
Am_Inter_Location::operator>=(const Am_Inter_Location &test) const
{
  int test_left, test_top, test_right, test_bottom;
  int my_left, my_top, my_right, my_bottom;

  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  if (!test.data)
    Am_Error("Other Am_Inter_Location not initialized");
  if (data->as_line)
    Am_Error("Can't test contain inside an Am_Inter_Location that is a Line");

  my_left = data->data.rect.left;
  my_top = data->data.rect.top;
  my_right = my_left + data->data.rect.width + 1;
  my_bottom = my_top + data->data.rect.height + 1;

  if (test.data->as_line) {
    test_left = test.data->data.line.x1;
    test_top = test.data->data.line.y1;
    test_right = test.data->data.line.x2;
    test_bottom = test.data->data.line.y2;
    isort(test_left, test_right, test_left, test_right);
    isort(test_top, test_bottom, test_top, test_bottom);
  } else {
    test_left = test.data->data.rect.left;
    test_top = test.data->data.rect.top;
    test_right = test_left + test.data->data.rect.width + 1;
    test_bottom = test_top + test.data->data.rect.height + 1;
  }

  if (data->ref_obj != test.data->ref_obj) {
    if (!Am_Translate_Coordinates(test.data->ref_obj, test_left, test_top,
                                  data->ref_obj, test_left, test_top))
      return false; //not in the same window
    Am_Translate_Coordinates(test.data->ref_obj, test_right, test_bottom,
                             data->ref_obj, test_right, test_bottom);
  }

  //now ready to do the comparisons
  if (test_left < my_left || test_left > my_right || test_right > my_right)
    return false;
  if (test_top < my_top || test_top > my_bottom || test_bottom > my_bottom)
    return false;
  return true;
}